

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clearerr.c
# Opt level: O0

int main(void)

{
  int iVar1;
  FILE *pFVar2;
  FILE *fh;
  
  pFVar2 = tmpfile();
  if (pFVar2 == (FILE *)0x0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdio/clearerr.c, line %d - %s\n"
           ,0x19,"( fh = tmpfile() ) != NULL");
  }
  iVar1 = ferror(pFVar2);
  if (iVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdio/clearerr.c, line %d - %s\n"
           ,0x1b,"! ferror( fh )");
  }
  iVar1 = feof(pFVar2);
  if (iVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdio/clearerr.c, line %d - %s\n"
           ,0x1c,"! feof( fh )");
  }
  rewind(pFVar2);
  iVar1 = fgetc(pFVar2);
  if (iVar1 != -1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdio/clearerr.c, line %d - %s\n"
           ,0x1f,"fgetc( fh ) == EOF");
  }
  iVar1 = ferror(pFVar2);
  if (iVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdio/clearerr.c, line %d - %s\n"
           ,0x20,"! ferror( fh )");
  }
  iVar1 = feof(pFVar2);
  if (iVar1 == 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdio/clearerr.c, line %d - %s\n"
           ,0x21,"feof( fh )");
  }
  clearerr(pFVar2);
  iVar1 = ferror(pFVar2);
  if (iVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdio/clearerr.c, line %d - %s\n"
           ,0x24,"! ferror( fh )");
  }
  iVar1 = feof(pFVar2);
  if (iVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdio/clearerr.c, line %d - %s\n"
           ,0x25,"! feof( fh )");
  }
  pFVar2 = freopen((char *)0x0,"w",pFVar2);
  if (pFVar2 == (FILE *)0x0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdio/clearerr.c, line %d - %s\n"
           ,0x28,"( fh = freopen( NULL, \"w\", fh ) ) != NULL");
  }
  iVar1 = fgetc(pFVar2);
  if (iVar1 != -1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdio/clearerr.c, line %d - %s\n"
           ,0x2a,"fgetc( fh ) == EOF");
  }
  iVar1 = ferror(pFVar2);
  if (iVar1 == 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdio/clearerr.c, line %d - %s\n"
           ,0x2b,"ferror( fh )");
  }
  iVar1 = feof(pFVar2);
  if (iVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdio/clearerr.c, line %d - %s\n"
           ,0x2c,"! feof( fh )");
  }
  clearerr(pFVar2);
  iVar1 = ferror(pFVar2);
  if (iVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdio/clearerr.c, line %d - %s\n"
           ,0x30,"! ferror( fh )");
  }
  iVar1 = feof(pFVar2);
  if (iVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdio/clearerr.c, line %d - %s\n"
           ,0x31,"! feof( fh )");
  }
  iVar1 = fclose(pFVar2);
  if (iVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdio/clearerr.c, line %d - %s\n"
           ,0x32,"fclose( fh ) == 0");
  }
  return TEST_RESULTS;
}

Assistant:

int main( void )
{
    FILE * fh;
    TESTCASE( ( fh = tmpfile() ) != NULL );
    /* Flags should be clear */
    TESTCASE( ! ferror( fh ) );
    TESTCASE( ! feof( fh ) );
    /* Reading from empty stream - should provoke EOF */
    rewind( fh );
    TESTCASE( fgetc( fh ) == EOF );
    TESTCASE( ! ferror( fh ) );
    TESTCASE( feof( fh ) );
    /* clearerr() should clear flags */
    clearerr( fh );
    TESTCASE( ! ferror( fh ) );
    TESTCASE( ! feof( fh ) );
#ifndef __ANDROID__
    /* reopen() the file write-only -- this fails on Termix */
    TESTCASE( ( fh = freopen( NULL, "w", fh ) ) != NULL );
    /* Reading from write-only stream - should provoke error */
    TESTCASE( fgetc( fh ) == EOF );
    TESTCASE( ferror( fh ) );
    TESTCASE( ! feof( fh ) );
#endif
    /* clearerr() should clear flags */
    clearerr( fh );
    TESTCASE( ! ferror( fh ) );
    TESTCASE( ! feof( fh ) );
    TESTCASE( fclose( fh ) == 0 );
    return TEST_RESULTS;
}